

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpipv6address.cpp
# Opt level: O1

bool __thiscall jrtplib::RTPIPv6Address::IsSameAddress(RTPIPv6Address *this,RTPAddress *addr)

{
  ulong uVar1;
  ulong uVar2;
  
  if ((((addr == (RTPAddress *)0x0) || (addr->addresstype != IPv6Address)) ||
      (this->port != *(uint16_t *)&addr[1].field_0xc)) ||
     ((this->super_RTPAddress).field_0xc != addr->field_0xc)) {
    return false;
  }
  uVar1 = 0;
  do {
    uVar2 = uVar1;
    if (uVar2 == 0xf) break;
    uVar1 = uVar2 + 1;
  } while ((&(this->super_RTPAddress).field_0xd)[uVar2] == (&addr->field_0xd)[uVar2]);
  return 0xe < uVar2;
}

Assistant:

bool RTPIPv6Address::IsSameAddress(const RTPAddress *addr) const
{
	if (addr == 0)
		return false;
	if (addr->GetAddressType() != RTPAddress::IPv6Address)
		return false;

	const RTPIPv6Address *addr2 = (const RTPIPv6Address *)addr;
	const uint8_t *ip2 = addr2->ip.s6_addr;
	
	if (port != addr2->port)
		return false;
	
	for (int i = 0 ; i < 16 ; i++)
	{
		if (ip.s6_addr[i] != ip2[i])
			return false;
	}
	return true;
}